

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_long>,unsigned_long>
          (STObject *this,SField *field,unsigned_long value)

{
  int iVar1;
  STBase *pSVar2;
  long lVar3;
  
  pSVar2 = getPField(this,field,true);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    pSVar2 = makeFieldPresent(this,field);
    if (pSVar2 == (STBase *)0x0) goto LAB_001fcbe6;
  }
  lVar3 = __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_long>::typeinfo,0);
  if (lVar3 != 0) {
    *(unsigned_long *)(lVar3 + 0x10) = value;
    return;
  }
LAB_001fcbe6:
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingSetValue (SField const& field, V value)
    {
        static_assert(!std::is_lvalue_reference<V>::value, "");

        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        cf->setValue (std::move (value));
    }